

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interpreter.cpp
# Opt level: O0

tuple<mjs::value,_mjs::value> * __thiscall
mjs::interpreter::impl::eval_call_member
          (tuple<mjs::value,_mjs::value> *__return_storage_ptr__,impl *this,expression *member)

{
  bool bVar1;
  int iVar2;
  token_type t;
  expression *peVar3;
  value local_100;
  value local_d8;
  undefined1 local_b0 [8];
  value r;
  value local_78;
  undefined1 local_50 [8];
  value l;
  binary_expression *be;
  expression *member_local;
  impl *this_local;
  
  iVar2 = (*(member->super_syntax_node)._vptr_syntax_node[3])();
  if (iVar2 == 9) {
    l.field_1._24_8_ = member;
    t = binary_expression::op((binary_expression *)member);
    bVar1 = is_reference_op(t);
    if (bVar1) {
      peVar3 = binary_expression::lhs((binary_expression *)l.field_1._24_8_);
      eval(&local_78,this,peVar3);
      get_value((value *)local_50,this,&local_78);
      value::~value(&local_78);
      peVar3 = binary_expression::rhs((binary_expression *)l.field_1._24_8_);
      eval((value *)local_b0,this,peVar3);
      make_reference(&local_d8,this,(value *)local_50,(value *)local_b0);
      std::tuple<mjs::value,_mjs::value>::tuple<mjs::value,_mjs::value_&,_true>
                (__return_storage_ptr__,&local_d8,(value *)local_50);
      value::~value(&local_d8);
      value::~value((value *)local_b0);
      value::~value((value *)local_50);
      return __return_storage_ptr__;
    }
  }
  eval(&local_100,this,member);
  std::tuple<mjs::value,_mjs::value>::tuple<mjs::value,_const_mjs::value_&,_true>
            (__return_storage_ptr__,&local_100,(value *)value::undefined);
  value::~value(&local_100);
  return __return_storage_ptr__;
}

Assistant:

auto eval_call_member(const expression& member) {
        // For strict mode we need to check if the MemberExpresson results in a primtive type
        // to be able to pass it on to the called function (even if the expression occurs in
        // a non-strict context)
        if (member.type() == expression_type::binary) {
            const auto& be = static_cast<const binary_expression&>(member);
            if (is_reference_op(be.op())) {
                // Commit to handling the evaluation
                auto l = get_value(eval(be.lhs()));
                auto r = eval(be.rhs());
                return std::tuple(make_reference(l, r), l);
            }
        }
        return std::tuple(eval(member), value::undefined);
    }